

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

void __thiscall
adios2::query::QueryComposite::BlockIndexEvaluate
          (QueryComposite *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  pointer pBVar1;
  BlockHit *cpy;
  bool bVar2;
  const_iterator __begin3;
  pointer pBVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  pointer pBVar8;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> currBlocks;
  BlockHit b;
  int local_b4;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_a8;
  QueryComposite *local_90;
  pointer local_88;
  IO *local_80;
  pointer local_78;
  BlockHit local_70;
  BlockHit local_50;
  
  local_78 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->m_Nodes).
             super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88 != local_78) {
    local_b4 = 0;
    local_90 = this;
    local_80 = io;
    do {
      local_a8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_start = (BlockHit *)0x0;
      local_a8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_finish = (BlockHit *)0x0;
      local_a8.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(*local_78)->_vptr_QueryBase[4])(*local_78,local_80,reader,&local_a8);
      pBVar1 = local_a8.
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b4 == 0) {
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::operator=
                  (touchedBlocks,&local_a8);
        iVar5 = 3;
      }
      else if (local_a8.
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               local_a8.
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               ._M_impl.super__Vector_impl_data._M_start) {
        iVar5 = 3;
        if (local_90->m_Relation == AND) {
          pBVar3 = (touchedBlocks->
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pBVar1 = (touchedBlocks->
                   super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          iVar5 = 2;
          pBVar8 = pBVar3;
          if (pBVar1 != pBVar3) {
            do {
              std::
              vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::~vector(&pBVar8->m_Regions);
              pBVar8 = pBVar8 + 1;
            } while (pBVar8 != pBVar1);
LAB_0062f8a1:
            (touchedBlocks->
            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>).
            _M_impl.super__Vector_impl_data._M_finish = pBVar3;
          }
        }
      }
      else {
        iVar4 = 0;
        cpy = local_a8.
              super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
              _M_impl.super__Vector_impl_data._M_start;
        if (local_90->m_Relation == OR) {
          for (; iVar5 = 0, pBVar1 != cpy; cpy = cpy + 1) {
            BlockHit::BlockHit(&local_70,cpy);
            pBVar3 = (touchedBlocks->
                     super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pBVar8 = (touchedBlocks->
                     super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (pBVar3 == pBVar8) {
LAB_0062f855:
              std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
              push_back(touchedBlocks,&local_70);
            }
            else {
              bVar7 = false;
              do {
                BlockHit::BlockHit(&local_50,pBVar3);
                bVar2 = BlockHit::applyExtension(&local_50,&local_70);
                if (bVar2) {
                  bVar7 = true;
                }
                std::
                vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::~vector(&local_50.m_Regions);
                pBVar3 = pBVar3 + 1;
              } while (pBVar3 != pBVar8);
              if (!bVar7) goto LAB_0062f855;
            }
            std::
            vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~vector(&local_70.m_Regions);
          }
        }
        else {
          iVar5 = 0;
          if (local_90->m_Relation == AND) {
            iVar5 = iVar4;
            if (local_a8.
                super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_a8.
                super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pBVar3 = (touchedBlocks->
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pBVar1 = (touchedBlocks->
                       super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              pBVar8 = pBVar3;
              if (pBVar1 != pBVar3) {
                do {
                  std::
                  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::~vector(&pBVar8->m_Regions);
                  pBVar8 = pBVar8 + 1;
                } while (pBVar8 != pBVar1);
                goto LAB_0062f8a1;
              }
            }
            else {
              lVar6 = (long)(touchedBlocks->
                            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(touchedBlocks->
                            super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                            )._M_impl.super__Vector_impl_data._M_start;
              if (lVar6 != 0) {
                lVar6 = lVar6 >> 5;
                do {
                  pBVar1 = local_a8.
                           super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (local_a8.
                      super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      local_a8.
                      super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0062f754:
                    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
                    _M_erase(touchedBlocks,
                             (touchedBlocks->
                             super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar6 + -1);
                  }
                  else {
                    bVar7 = false;
                    pBVar3 = local_a8.
                             super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      BlockHit::BlockHit(&local_70,pBVar3);
                      bVar2 = BlockHit::applyIntersection
                                        ((touchedBlocks->
                                         super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar6,
                                         &local_70);
                      if (bVar2) {
                        bVar7 = true;
                      }
                      std::
                      vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::~vector(&local_70.m_Regions);
                      pBVar3 = pBVar3 + 1;
                    } while (pBVar3 != pBVar1 && !bVar2);
                    if (!bVar7) goto LAB_0062f754;
                  }
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
                iVar5 = 0;
              }
            }
          }
        }
      }
      std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                (&local_a8);
      if ((iVar5 != 3) && (iVar5 != 0)) {
        return;
      }
      local_b4 = local_b4 + 1;
      local_78 = local_78 + 1;
    } while (local_78 != local_88);
  }
  return;
}

Assistant:

void QueryComposite::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                        // std::vector<Box<Dims>> &touchedBlocks)
                                        std::vector<BlockHit> &touchedBlocks)
{
    auto lf_ApplyAND = [&](std::vector<BlockHit> &touched,
                           const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
        {
            touched.clear();
            return;
        }

        for (auto i = touched.size(); i >= 1; i--)
        {
            bool intersects = false;
            for (auto b : curr)
            {
                if (touched[i].applyIntersection(b))
                {
                    intersects = true;
                    break;
                }
            }
            if (!intersects)
                touched.erase(touched.begin() + i - 1);
        }
    }; // lf_ApplyAND

    auto lf_ApplyOR = [&](std::vector<BlockHit> &touched,
                          const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
            return;

        for (auto b : curr)
        {
            bool duplicated = false;
            for (auto box : touched)
            {
                if (box.applyExtension(b))
                {
                    duplicated = true;
                    continue;
                }
            }
            if (!duplicated)
                touched.push_back(b);
        }
    }; // lf_ApplyOR

    if (m_Nodes.size() == 0)
        return;

    int counter = 0;
    for (auto node : m_Nodes)
    {
        counter++;
        std::vector<BlockHit> currBlocks;
        node->BlockIndexEvaluate(io, reader, currBlocks);
        if (counter == 1)
        {
            touchedBlocks = currBlocks;
            continue;
        }

        if (currBlocks.size() == 0)
        {
            if (adios2::query::Relation::AND == m_Relation)
            {
                touchedBlocks.clear();
                break;
            }
            else
                continue;
        }

        if (adios2::query::Relation::AND == m_Relation)
            lf_ApplyAND(touchedBlocks, currBlocks);
        else if (adios2::query::Relation::OR == m_Relation)
            lf_ApplyOR(touchedBlocks, currBlocks);
    }
}